

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmwrtimg.cpp
# Opt level: O3

void __thiscall
CVmImageWriter::fix_pool_def(CVmImageWriter *this,long def_seek_ofs,uint32_t page_count)

{
  CVmFile *pCVar1;
  long lVar2;
  long lVar3;
  uint32_t tmp;
  char buf [4];
  uint32_t local_2c;
  
  pCVar1 = this->fp_;
  lVar3 = ftell((FILE *)pCVar1->fp_);
  lVar2 = pCVar1->seek_base_;
  fseek((FILE *)this->fp_->fp_,def_seek_ofs + this->fp_->seek_base_ + 0xc,0);
  local_2c = page_count;
  CVmFile::write_bytes(this->fp_,(char *)&local_2c,4);
  fseek((FILE *)this->fp_->fp_,(lVar3 - lVar2) + this->fp_->seek_base_,0);
  return;
}

Assistant:

void CVmImageWriter::fix_pool_def(long def_seek_ofs, uint32_t page_count)
{
    long old_pos;
    char buf[4];

    /* note the file position at entry */
    old_pos = fp_->get_pos();
    
    /* 
     *   seek to the original definition block location, plus the size of
     *   the block header (10 bytes), plus the offset within the block of
     *   the pool page count (it starts 2 bytes into the block data) 
     */
    fp_->set_pos(def_seek_ofs + 10 + 2);

    /* write the page count */
    oswp4(buf, page_count);
    fp_->write_bytes(buf, 4);

    /* seek back to our location at entry */
    fp_->set_pos(old_pos);
}